

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_link_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
::compute_link_blockers
          (Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *this,Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 *parent_complex,Simplex *alpha_parent,bool is_alpha_blocker)

{
  integer_iterator<unsigned_long> *this_00;
  type_conflict1 tVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  reference_type_of_temporary_wrapper pVVar5;
  reference pVVar6;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *this_01;
  reference_type pSVar7;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  iVar8;
  bool local_251;
  undefined1 local_228 [8];
  Simplex eta_minus_alpha;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *eta_parent;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __end0_3;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __begin0_3;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  local_1d8;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  *local_1c8;
  Const_complex_blocker_around_vertex_range *__range9;
  const_iterator cStack_1b8;
  Vertex_handle a;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  Simplex *__range8;
  undefined1 local_198 [7];
  bool is_new_blocker;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  sigma_link;
  Root_simplex_handle sigma_id;
  undefined1 local_128 [8];
  Simplex sigma_parent;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *blocker_parent;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __end0_1;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __begin0_1;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  local_d8;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  *local_c8;
  Const_complex_blocker_around_vertex_range *__range4;
  boost_vertex_handle local_ac;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_a8;
  Vertex_handle local_a0;
  boost_vertex_handle local_9c;
  Vertex_handle x_parent;
  Vertex_handle x_link;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __end0;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __begin0;
  Complex_vertex_range *__range3;
  bool is_alpha_blocker_local;
  Simplex *alpha_parent_local;
  Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *parent_complex_local;
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *this_local;
  
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  ::vertex_range((Complex_vertex_range *)&__begin0.vertexIterator.second,
                 (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  *)this);
  this_00 = &__begin0.vertexIterator.second;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *)&__end0.vertexIterator.second,
          (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
           *)this_00);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
         *)&x_parent,
        (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
         *)this_00);
  do {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                        *)&__end0.vertexIterator.second,
                       (iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                        *)&x_parent);
    if (!tVar1) {
      return;
    }
    local_ac = (boost_vertex_handle)
               boost::iterators::detail::
               iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
               ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                            *)&__end0.vertexIterator.second);
    local_9c = local_ac;
    give_equivalent_vertex(&local_a8,this,parent_complex,(Vertex_handle)local_ac);
    pVVar5 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&local_a8);
    local_a0.vertex = pVVar5->vertex;
    boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
    ~optional(&local_a8);
    local_d8 = (iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                )Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 ::const_blocker_range
                           (&parent_complex->
                             super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            ,local_a0);
    local_c8 = &local_d8;
    __end0_1 = boost::iterator_range_detail::
               iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
               ::begin(local_c8);
    blocker_parent =
         (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          *)boost::iterator_range_detail::
            iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
            ::end(local_c8);
    while( true ) {
      tVar1 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                          *)&__end0_1,
                         (iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                          *)&blocker_parent);
      if (!tVar1) break;
      sigma_parent.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)boost::iterators::detail::
                   iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                   ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                                *)&__end0_1);
      if (is_alpha_blocker) {
        bVar2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                ::operator!=((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                              *)sigma_parent.simplex_set._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,alpha_parent);
        if (bVar2) goto LAB_00137f2a;
      }
      else {
LAB_00137f2a:
        Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
        ::Skeleton_blocker_simplex
                  ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)local_128,
                   (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)sigma_parent.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
        ::difference((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                      *)local_128,alpha_parent);
        iVar4 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                ::dimension((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                             *)local_128);
        local_251 = false;
        if (1 < iVar4) {
          sigma_id.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::first_vertex((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                               *)local_128);
          local_251 = Skeleton_blocker_simple_traits::Vertex_handle::operator==
                                ((Vertex_handle *)
                                 ((long)&sigma_id.simplex_set._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 4),&local_a0);
        }
        if (local_251 != false) {
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
          ::get_id((Root_simplex_handle *)((long)&sigma_link.super_type.m_storage.dummy_ + 0x28),
                   &parent_complex->
                    super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                   ,(Simplex *)local_128);
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
          ::get_simplex_address
                    ((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                      *)local_198,
                     (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                      *)this,(Root_simplex_handle *)
                             ((long)&sigma_link.super_type.m_storage.dummy_ + 0x28));
          bVar2 = boost::
                  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  ::operator!((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                               *)local_198);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            bVar2 = true;
            __end0_2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                       ::begin(alpha_parent);
            cStack_1b8 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                         ::end(alpha_parent);
            while( true ) {
              bVar3 = std::operator!=(&__end0_2,&stack0xfffffffffffffe48);
              if (!bVar3) break;
              pVVar6 = std::
                       _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                       ::operator*(&__end0_2);
              __range9._4_4_ = pVVar6->vertex;
              iVar8 = (iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                       )Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                        ::const_blocker_range
                                  (&parent_complex->
                                    super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                                   ,__range9._4_4_);
              local_1c8 = &local_1d8;
              local_1d8 = iVar8;
              __end0_3 = boost::iterator_range_detail::
                         iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                         ::begin(local_1c8);
              eta_parent = (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                            *)boost::iterator_range_detail::
                              iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                              ::end(local_1c8);
              while( true ) {
                tVar1 = boost::iterators::operator!=
                                  ((iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                    *)&__end0_3,
                                   (iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                    *)&eta_parent);
                if (!tVar1) break;
                eta_minus_alpha.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)boost::iterators::detail::
                             iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                             ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                                          *)&__end0_3);
                if (is_alpha_blocker) {
                  bVar3 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          ::operator!=((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)eta_minus_alpha.simplex_set._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count,alpha_parent);
                  if (bVar3) goto LAB_0013816a;
                }
                else {
LAB_0013816a:
                  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                  ::Skeleton_blocker_simplex
                            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                              *)local_228,
                             (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                              *)eta_minus_alpha.simplex_set._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                  ::difference((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                *)local_228,alpha_parent);
                  bVar3 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          ::operator!=((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)local_228,
                                       (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)local_128);
                  if (bVar3) {
                    bVar3 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                            ::contains_difference
                                      ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)local_128,
                                       (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)eta_minus_alpha.simplex_set._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count,alpha_parent);
                    if (!bVar3) goto LAB_0013828a;
                    bVar2 = false;
                    bVar3 = true;
                  }
                  else {
LAB_0013828a:
                    bVar3 = false;
                  }
                  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                  ::~Skeleton_blocker_simplex
                            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                              *)local_228);
                  if (bVar3) break;
                }
                boost::iterators::detail::
                iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                              *)&__end0_3);
              }
              if (!bVar2) break;
              std::
              _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::operator++(&__end0_2);
            }
            if (bVar2) {
              this_01 = (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                         *)operator_new(0x30);
              pSVar7 = boost::
                       optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                       ::operator*((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                                    *)local_198);
              Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::Skeleton_blocker_simplex(this_01,pSVar7);
              Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
              ::add_blocker((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                             *)this,this_01);
            }
          }
          boost::
          optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
          ::~optional((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                       *)local_198);
          Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
          ::~Skeleton_blocker_simplex
                    ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
                      *)((long)&sigma_link.super_type.m_storage.dummy_ + 0x28));
        }
        Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
        ::~Skeleton_blocker_simplex
                  ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *)local_128);
      }
      boost::iterators::detail::
      iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                    *)&__end0_1);
    }
    boost::iterators::detail::
    iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                  *)&__end0.vertexIterator.second);
  } while( true );
}

Assistant:

void compute_link_blockers(const ComplexType & parent_complex,
                             const Simplex& alpha_parent,
                             bool is_alpha_blocker = false) {
    for (auto x_link : this->vertex_range()) {
      Vertex_handle x_parent = *this->give_equivalent_vertex(parent_complex,
                                                             x_link);

      for (auto blocker_parent : parent_complex.const_blocker_range(x_parent)) {
        if (!is_alpha_blocker || *blocker_parent != alpha_parent) {
          Simplex sigma_parent(*blocker_parent);

          sigma_parent.difference(alpha_parent);

          if (sigma_parent.dimension() >= 2
              && sigma_parent.first_vertex() == x_parent) {
            Root_simplex_handle sigma_id(parent_complex.get_id(sigma_parent));
            auto sigma_link = this->get_simplex_address(sigma_id);
            // ie if the vertices of sigma are vertices of the link
            if (sigma_link) {
              bool is_new_blocker = true;
              for (auto a : alpha_parent) {
                for (auto eta_parent : parent_complex.const_blocker_range(a)) {
                  if (!is_alpha_blocker || *eta_parent != alpha_parent) {
                    Simplex eta_minus_alpha(*eta_parent);
                    eta_minus_alpha.difference(alpha_parent);
                    if (eta_minus_alpha != sigma_parent
                        && sigma_parent.contains_difference(*eta_parent,
                                                            alpha_parent)) {
                      is_new_blocker = false;
                      break;
                    }
                  }
                }
                if (!is_new_blocker)
                  break;
              }
              if (is_new_blocker)
                this->add_blocker(new Simplex(*sigma_link));
            }
          }
        }
      }
    }
  }